

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_index_info *
allocateIndexInfo(Parse *pParse,WhereClause *pWC,Bitmask mUnusable,SrcList_item *pSrc,
                 ExprList *pOrderBy,u16 *pmNoOmit)

{
  Expr *pEVar1;
  int iVar2;
  yDbMask *pyVar3;
  yDbMask *pyVar4;
  Expr *pExpr_1;
  u16 op;
  Expr *pExpr;
  int n;
  u16 mNoOmit;
  sqlite3_index_info *pIdxInfo;
  WhereTerm *pWStack_78;
  int nOrderBy;
  WhereTerm *pTerm;
  HiddenIndexInfo *pHidden;
  sqlite3_index_constraint_usage *pUsage;
  sqlite3_index_orderby *pIdxOrderBy;
  sqlite3_index_constraint *pIdxCons;
  int local_48;
  int nTerm;
  int j;
  int i;
  u16 *pmNoOmit_local;
  ExprList *pOrderBy_local;
  SrcList_item *pSrc_local;
  Bitmask mUnusable_local;
  WhereClause *pWC_local;
  Parse *pParse_local;
  
  pExpr._6_2_ = 0;
  pIdxCons._4_4_ = 0;
  nTerm = 0;
  pWStack_78 = pWC->a;
  for (; nTerm < pWC->nTerm; nTerm = nTerm + 1) {
    if (((pWStack_78->leftCursor == pSrc->iCursor) && ((pWStack_78->prereqRight & mUnusable) == 0))
       && ((pWStack_78->eOperator & 0xf7ff) != 0)) {
      pIdxCons._4_4_ = pIdxCons._4_4_ + 1;
    }
    pWStack_78 = pWStack_78 + 1;
  }
  pIdxInfo._4_4_ = 0;
  if (pOrderBy != (ExprList *)0x0) {
    iVar2 = pOrderBy->nExpr;
    nTerm = 0;
    while (((nTerm < iVar2 && (pEVar1 = pOrderBy->a[nTerm].pExpr, pEVar1->op == 0xa2)) &&
           (pEVar1->iTable == pSrc->iCursor))) {
      nTerm = nTerm + 1;
    }
    if (nTerm == iVar2) {
      pIdxInfo._4_4_ = iVar2;
    }
  }
  pParse_local = (Parse *)sqlite3DbMallocZero(pParse->db,
                                              (long)pIdxCons._4_4_ * 0x14 + (long)pIdxInfo._4_4_ * 8
                                              + 0x70);
  if (pParse_local == (Parse *)0x0) {
    sqlite3ErrorMsg(pParse,"out of memory");
    pParse_local = (Parse *)0x0;
  }
  else {
    pyVar3 = &pParse_local->writeMask;
    pyVar4 = pyVar3 + (long)pIdxCons._4_4_ * 3;
    *(int *)&pParse_local->db = pIdxCons._4_4_;
    *(int *)&pParse_local->pVdbe = pIdxInfo._4_4_;
    pParse_local->zErrMsg = (char *)pyVar3;
    *(yDbMask **)&pParse_local->rc = pyVar4;
    *(yDbMask **)&pParse_local->isMultiWrite = pyVar4 + (long)pIdxInfo._4_4_ * 2;
    (pParse_local->constraintName).z = (char *)pWC;
    *(Parse **)&(pParse_local->constraintName).n = pParse;
    local_48 = 0;
    nTerm = 0;
    pWStack_78 = pWC->a;
    for (; nTerm < pWC->nTerm; nTerm = nTerm + 1) {
      if (((pWStack_78->leftCursor == pSrc->iCursor) && ((pWStack_78->prereqRight & mUnusable) == 0)
          ) && (((pWStack_78->eOperator & 0xf7ff) != 0 &&
                (((((pSrc->fg).jointype & 8) == 0 || ((pWStack_78->pExpr->flags & 1) != 0)) ||
                 ((pWStack_78->eOperator & 0x180) == 0)))))) {
        pyVar3[(long)local_48 * 3] = (pWStack_78->u).leftColumn;
        pyVar3[(long)local_48 * 3 + 2] = nTerm;
        pExpr_1._6_2_ = pWStack_78->eOperator & 0x1fff;
        if (pExpr_1._6_2_ == 1) {
          pExpr_1._6_2_ = 2;
        }
        if (pExpr_1._6_2_ == 0x40) {
          *(u8 *)(pyVar3 + (long)local_48 * 3 + 1) = pWStack_78->eMatchOp;
        }
        else if ((pExpr_1._6_2_ & 0x180) == 0) {
          *(char *)(pyVar3 + (long)local_48 * 3 + 1) = (char)pExpr_1._6_2_;
          if (((pExpr_1._6_2_ & 0x3c) != 0) &&
             (iVar2 = sqlite3ExprIsVector(pWStack_78->pExpr->pRight), iVar2 != 0)) {
            if (nTerm < 0x10) {
              pExpr._6_2_ = pExpr._6_2_ | (ushort)(1 << ((byte)nTerm & 0x1f));
            }
            if (pExpr_1._6_2_ == 0x10) {
              *(undefined1 *)(pyVar3 + (long)local_48 * 3 + 1) = 8;
            }
            if (pExpr_1._6_2_ == 4) {
              *(undefined1 *)(pyVar3 + (long)local_48 * 3 + 1) = 0x20;
            }
          }
        }
        else if (pExpr_1._6_2_ == 0x100) {
          *(undefined1 *)(pyVar3 + (long)local_48 * 3 + 1) = 0x47;
        }
        else {
          *(undefined1 *)(pyVar3 + (long)local_48 * 3 + 1) = 0x48;
        }
        local_48 = local_48 + 1;
      }
      pWStack_78 = pWStack_78 + 1;
    }
    for (nTerm = 0; nTerm < pIdxInfo._4_4_; nTerm = nTerm + 1) {
      pyVar4[(long)nTerm * 2] = (int)(pOrderBy->a[nTerm].pExpr)->iColumn;
      *(u8 *)(pyVar4 + (long)nTerm * 2 + 1) = pOrderBy->a[nTerm].sortOrder;
    }
    *pmNoOmit = pExpr._6_2_;
  }
  return (sqlite3_index_info *)pParse_local;
}

Assistant:

static sqlite3_index_info *allocateIndexInfo(
  Parse *pParse,                  /* The parsing context */
  WhereClause *pWC,               /* The WHERE clause being analyzed */
  Bitmask mUnusable,              /* Ignore terms with these prereqs */
  struct SrcList_item *pSrc,      /* The FROM clause term that is the vtab */
  ExprList *pOrderBy,             /* The ORDER BY clause */
  u16 *pmNoOmit                   /* Mask of terms not to omit */
){
  int i, j;
  int nTerm;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_orderby *pIdxOrderBy;
  struct sqlite3_index_constraint_usage *pUsage;
  struct HiddenIndexInfo *pHidden;
  WhereTerm *pTerm;
  int nOrderBy;
  sqlite3_index_info *pIdxInfo;
  u16 mNoOmit = 0;

  /* Count the number of possible WHERE clause constraints referring
  ** to this virtual table */
  for(i=nTerm=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    if( pTerm->leftCursor != pSrc->iCursor ) continue;
    if( pTerm->prereqRight & mUnusable ) continue;
    assert( IsPowerOfTwo(pTerm->eOperator & ~WO_EQUIV) );
    testcase( pTerm->eOperator & WO_IN );
    testcase( pTerm->eOperator & WO_ISNULL );
    testcase( pTerm->eOperator & WO_IS );
    testcase( pTerm->eOperator & WO_ALL );
    if( (pTerm->eOperator & ~(WO_EQUIV))==0 ) continue;
    if( pTerm->wtFlags & TERM_VNULL ) continue;
    assert( pTerm->u.leftColumn>=(-1) );
    nTerm++;
  }

  /* If the ORDER BY clause contains only columns in the current 
  ** virtual table then allocate space for the aOrderBy part of
  ** the sqlite3_index_info structure.
  */
  nOrderBy = 0;
  if( pOrderBy ){
    int n = pOrderBy->nExpr;
    for(i=0; i<n; i++){
      Expr *pExpr = pOrderBy->a[i].pExpr;
      if( pExpr->op!=TK_COLUMN || pExpr->iTable!=pSrc->iCursor ) break;
    }
    if( i==n){
      nOrderBy = n;
    }
  }

  /* Allocate the sqlite3_index_info structure
  */
  pIdxInfo = sqlite3DbMallocZero(pParse->db, sizeof(*pIdxInfo)
                           + (sizeof(*pIdxCons) + sizeof(*pUsage))*nTerm
                           + sizeof(*pIdxOrderBy)*nOrderBy + sizeof(*pHidden) );
  if( pIdxInfo==0 ){
    sqlite3ErrorMsg(pParse, "out of memory");
    return 0;
  }

  /* Initialize the structure.  The sqlite3_index_info structure contains
  ** many fields that are declared "const" to prevent xBestIndex from
  ** changing them.  We have to do some funky casting in order to
  ** initialize those fields.
  */
  pHidden = (struct HiddenIndexInfo*)&pIdxInfo[1];
  pIdxCons = (struct sqlite3_index_constraint*)&pHidden[1];
  pIdxOrderBy = (struct sqlite3_index_orderby*)&pIdxCons[nTerm];
  pUsage = (struct sqlite3_index_constraint_usage*)&pIdxOrderBy[nOrderBy];
  *(int*)&pIdxInfo->nConstraint = nTerm;
  *(int*)&pIdxInfo->nOrderBy = nOrderBy;
  *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint = pIdxCons;
  *(struct sqlite3_index_orderby**)&pIdxInfo->aOrderBy = pIdxOrderBy;
  *(struct sqlite3_index_constraint_usage**)&pIdxInfo->aConstraintUsage =
                                                                   pUsage;

  pHidden->pWC = pWC;
  pHidden->pParse = pParse;
  for(i=j=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    u16 op;
    if( pTerm->leftCursor != pSrc->iCursor ) continue;
    if( pTerm->prereqRight & mUnusable ) continue;
    assert( IsPowerOfTwo(pTerm->eOperator & ~WO_EQUIV) );
    testcase( pTerm->eOperator & WO_IN );
    testcase( pTerm->eOperator & WO_IS );
    testcase( pTerm->eOperator & WO_ISNULL );
    testcase( pTerm->eOperator & WO_ALL );
    if( (pTerm->eOperator & ~(WO_EQUIV))==0 ) continue;
    if( pTerm->wtFlags & TERM_VNULL ) continue;
    if( (pSrc->fg.jointype & JT_LEFT)!=0
     && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
     && (pTerm->eOperator & (WO_IS|WO_ISNULL))
    ){
      /* An "IS" term in the WHERE clause where the virtual table is the rhs
      ** of a LEFT JOIN. Do not pass this term to the virtual table
      ** implementation, as this can lead to incorrect results from SQL such
      ** as:
      **
      **   "LEFT JOIN vtab WHERE vtab.col IS NULL"  */
      testcase( pTerm->eOperator & WO_ISNULL );
      testcase( pTerm->eOperator & WO_IS );
      continue;
    }
    assert( pTerm->u.leftColumn>=(-1) );
    pIdxCons[j].iColumn = pTerm->u.leftColumn;
    pIdxCons[j].iTermOffset = i;
    op = pTerm->eOperator & WO_ALL;
    if( op==WO_IN ) op = WO_EQ;
    if( op==WO_AUX ){
      pIdxCons[j].op = pTerm->eMatchOp;
    }else if( op & (WO_ISNULL|WO_IS) ){
      if( op==WO_ISNULL ){
        pIdxCons[j].op = SQLITE_INDEX_CONSTRAINT_ISNULL;
      }else{
        pIdxCons[j].op = SQLITE_INDEX_CONSTRAINT_IS;
      }
    }else{
      pIdxCons[j].op = (u8)op;
      /* The direct assignment in the previous line is possible only because
      ** the WO_ and SQLITE_INDEX_CONSTRAINT_ codes are identical.  The
      ** following asserts verify this fact. */
      assert( WO_EQ==SQLITE_INDEX_CONSTRAINT_EQ );
      assert( WO_LT==SQLITE_INDEX_CONSTRAINT_LT );
      assert( WO_LE==SQLITE_INDEX_CONSTRAINT_LE );
      assert( WO_GT==SQLITE_INDEX_CONSTRAINT_GT );
      assert( WO_GE==SQLITE_INDEX_CONSTRAINT_GE );
      assert( pTerm->eOperator&(WO_IN|WO_EQ|WO_LT|WO_LE|WO_GT|WO_GE|WO_AUX) );

      if( op & (WO_LT|WO_LE|WO_GT|WO_GE)
       && sqlite3ExprIsVector(pTerm->pExpr->pRight) 
      ){
        if( i<16 ) mNoOmit |= (1 << i);
        if( op==WO_LT ) pIdxCons[j].op = WO_LE;
        if( op==WO_GT ) pIdxCons[j].op = WO_GE;
      }
    }

    j++;
  }
  for(i=0; i<nOrderBy; i++){
    Expr *pExpr = pOrderBy->a[i].pExpr;
    pIdxOrderBy[i].iColumn = pExpr->iColumn;
    pIdxOrderBy[i].desc = pOrderBy->a[i].sortOrder;
  }

  *pmNoOmit = mNoOmit;
  return pIdxInfo;
}